

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder_utils.c
# Opt level: O1

Qiniu_Error
Qiniu_Utils_New_Medium
          (Qiniu_Recorder *recorder,char *recorderKey,Qiniu_Int64 version,
          Qiniu_Record_Medium *medium,Qiniu_FileInfo *fileInfo)

{
  uint uVar1;
  cJSON *object;
  time_t tVar2;
  cJSON *pcVar3;
  char *pcVar4;
  Qiniu_Error QVar5;
  
  QVar5 = (*recorder->open)(recorder,recorderKey,"wb",medium);
  pcVar4 = QVar5.message;
  uVar1 = QVar5.code;
  if (uVar1 == 200) {
    object = cJSON_CreateObject();
    tVar2 = time((time_t *)0x0);
    pcVar3 = cJSON_CreateNumber((double)tVar2);
    cJSON_AddItemToObject(object,"createTime",pcVar3);
    pcVar3 = cJSON_CreateNumber((double)fileInfo->st_size);
    cJSON_AddItemToObject(object,"fileSize",pcVar3);
    pcVar3 = cJSON_CreateNumber((double)(fileInfo->st_mtim).tv_sec);
    cJSON_AddItemToObject(object,"modTime",pcVar3);
    pcVar3 = cJSON_CreateNumber((double)version);
    cJSON_AddItemToObject(object,"version",pcVar3);
    pcVar4 = cJSON_PrintUnformatted(object);
    cJSON_Delete(object);
    QVar5 = (*medium->writeEntry)(medium,pcVar4,(size_t *)0x0);
    free(pcVar4);
    pcVar4 = QVar5.message;
    uVar1 = QVar5.code;
    if (QVar5.code == 200) {
      pcVar4 = Qiniu_OK.message;
      uVar1 = Qiniu_OK.code;
    }
  }
  QVar5._4_4_ = 0;
  QVar5.code = uVar1;
  QVar5.message = pcVar4;
  return QVar5;
}

Assistant:

Qiniu_Error Qiniu_Utils_New_Medium(Qiniu_Recorder *recorder, const char *recorderKey, Qiniu_Int64 version, struct Qiniu_Record_Medium *medium, Qiniu_FileInfo *fileInfo)
{
	Qiniu_Error err = recorder->open(recorder, recorderKey, "wb", medium);
	if (err.code != 200)
	{
		return err;
	}
	cJSON *metadata = cJSON_CreateObject();
	cJSON_AddItemToObject(metadata, "createTime", cJSON_CreateNumber(time(NULL)));
	cJSON_AddItemToObject(metadata, "fileSize", cJSON_CreateNumber(fileInfo->st_size));
	cJSON_AddItemToObject(metadata, "modTime", cJSON_CreateNumber(fileInfo->st_mtime));
	cJSON_AddItemToObject(metadata, "version", cJSON_CreateNumber(version));
	char *metadataJson = cJSON_PrintUnformatted(metadata);
	cJSON_Delete(metadata);
	if (metadataJson == NULL)
	{
		err.code = 400;
		err.message = "cJSON_PrintUnformatted() error";
	}
	err = medium->writeEntry(medium, metadataJson, NULL);
	free(metadataJson);
	if (err.code != 200)
	{
		return err;
	}
	return Qiniu_OK;
}